

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

bsc_step_t
bsc_bcast_root_p_tree_multiple
          (bsc_step_t depends,bsp_pid_t root,bsc_group_t group,bsc_coll_params_t *params,
          bsc_size_t n)

{
  double dVar1;
  int local_44;
  bsc_step_t local_40;
  int local_3c;
  bsc_step_t finished;
  bsc_size_t i;
  bsc_pid_t root_n;
  bsc_pid_t P;
  group_t *g;
  bsc_size_t n_local;
  bsc_coll_params_t *params_local;
  bsc_group_t group_local;
  bsp_pid_t root_local;
  bsc_step_t depends_local;
  
  if (group == (bsc_group_t)0x0) {
    local_44 = bsp_nprocs();
  }
  else {
    local_44 = *group;
  }
  dVar1 = sqrt((double)local_44);
  dVar1 = ceil(dVar1);
  local_40 = depends;
  for (local_3c = 0; local_3c < n; local_3c = local_3c + 1) {
    local_40 = bsc_bcast_qtree_single
                         (depends,root,group,params[local_3c].src,params[local_3c].dst,
                          params[local_3c].size,(int)dVar1);
  }
  return local_40;
}

Assistant:

bsc_step_t bsc_bcast_root_p_tree_multiple( bsc_step_t depends,
                      bsp_pid_t root, bsc_group_t group, 
                      bsc_coll_params_t * params, bsc_size_t n)
{
    group_t * g = group;
    bsc_pid_t P = g?g->size:bsp_nprocs(), root_n = (bsc_pid_t) ceil(sqrt(P));
    bsc_size_t i;
    bsc_step_t finished = depends;
    for ( i = 0; i < n ; ++i ) {
        finished = bsc_bcast_qtree_single( depends, root, group,
                params[i].src, params[i].dst, params[i].size, root_n );
    }

    return finished;
}